

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::UnderscoresToCamelCase_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,string_view input,bool cap_next_letter)

{
  size_type sVar1;
  const_reference pvVar2;
  ulong local_30;
  size_t i;
  undefined1 auStack_20 [7];
  bool cap_next_letter_local;
  string_view input_local;
  string *result;
  
  input_local._M_len = input._M_len;
  i._7_1_ = (byte)input._M_str & 1;
  _auStack_20 = this;
  input_local._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_30 = 0;
      sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20),
      local_30 < sVar1; local_30 = local_30 + 1) {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,local_30);
    if ((*pvVar2 < 'a') ||
       (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,local_30)
       , 'z' < *pvVar2)) {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,local_30);
      if ((*pvVar2 < 'A') ||
         (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,
                              local_30), 'Z' < *pvVar2)) {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,local_30)
        ;
        if (('/' < *pvVar2) &&
           (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                               ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,
                                local_30), *pvVar2 < ':')) {
          pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,
                              local_30);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pvVar2);
        }
        i._7_1_ = 1;
      }
      else {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,local_30)
        ;
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pvVar2);
        i._7_1_ = 0;
      }
    }
    else {
      if (i._7_1_ == 0) {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,local_30)
        ;
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pvVar2);
      }
      else {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,local_30)
        ;
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pvVar2 + -0x20);
      }
      i._7_1_ = 0;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string UnderscoresToCamelCase(absl::string_view input,
                                   bool cap_next_letter) {
  std::string result;
  // Note:  I distrust ctype.h due to locales.
  for (size_t i = 0; i < input.size(); ++i) {
    if ('a' <= input[i] && input[i] <= 'z') {
      if (cap_next_letter) {
        result += input[i] + ('A' - 'a');
      } else {
        result += input[i];
      }
      cap_next_letter = false;
    } else if ('A' <= input[i] && input[i] <= 'Z') {
      // Capital letters are left as-is.
      result += input[i];
      cap_next_letter = false;
    } else if ('0' <= input[i] && input[i] <= '9') {
      result += input[i];
      cap_next_letter = true;
    } else {
      cap_next_letter = true;
    }
  }
  return result;
}